

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QMovableArrayOps<QTextBrowserPrivate::HistoryEntry>::
emplace<QTextBrowserPrivate::HistoryEntry_const&>
          (QMovableArrayOps<QTextBrowserPrivate::HistoryEntry> *this,qsizetype i,HistoryEntry *args)

{
  undefined1 uVar1;
  uint uVar2;
  qsizetype qVar3;
  Inserter *in_RDX;
  char16_t *in_RSI;
  HistoryEntry *in_RDI;
  long in_FS_OFFSET;
  bool bVar4;
  GrowthPosition pos;
  bool growsAtBegin;
  bool detach;
  HistoryEntry tmp;
  undefined7 in_stack_ffffffffffffff68;
  undefined1 in_stack_ffffffffffffff6f;
  undefined1 uVar5;
  undefined4 in_stack_ffffffffffffff78;
  undefined2 in_stack_ffffffffffffff7c;
  undefined1 in_stack_ffffffffffffff7e;
  byte bVar6;
  HistoryEntry *this_00;
  Inserter local_68;
  undefined1 local_40 [56];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  uVar1 = QArrayDataPointer<QTextBrowserPrivate::HistoryEntry>::needsDetach
                    ((QArrayDataPointer<QTextBrowserPrivate::HistoryEntry> *)in_RDI);
  if (!(bool)uVar1) {
    if ((in_RSI == (in_RDI->title).d.ptr) &&
       (qVar3 = QArrayDataPointer<QTextBrowserPrivate::HistoryEntry>::freeSpaceAtEnd
                          ((QArrayDataPointer<QTextBrowserPrivate::HistoryEntry> *)
                           CONCAT17(uVar1,CONCAT16(in_stack_ffffffffffffff7e,
                                                   CONCAT24(in_stack_ffffffffffffff7c,
                                                            in_stack_ffffffffffffff78)))),
       qVar3 != 0)) {
      QArrayDataPointer<QTextBrowserPrivate::HistoryEntry>::end
                ((QArrayDataPointer<QTextBrowserPrivate::HistoryEntry> *)in_RDI);
      QTextBrowserPrivate::HistoryEntry::HistoryEntry
                (in_RDI,(HistoryEntry *)
                        CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
      (in_RDI->title).d.ptr = (char16_t *)((long)(in_RDI->title).d.ptr + 1);
      goto LAB_006e48a8;
    }
    if ((in_RSI == (char16_t *)0x0) &&
       (qVar3 = QArrayDataPointer<QTextBrowserPrivate::HistoryEntry>::freeSpaceAtBegin
                          ((QArrayDataPointer<QTextBrowserPrivate::HistoryEntry> *)
                           CONCAT17(uVar1,CONCAT16(in_stack_ffffffffffffff7e,
                                                   CONCAT24(in_stack_ffffffffffffff7c,
                                                            in_stack_ffffffffffffff78)))),
       qVar3 != 0)) {
      QArrayDataPointer<QTextBrowserPrivate::HistoryEntry>::begin
                ((QArrayDataPointer<QTextBrowserPrivate::HistoryEntry> *)0x6e477a);
      QTextBrowserPrivate::HistoryEntry::HistoryEntry
                (in_RDI,(HistoryEntry *)
                        CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
      (in_RDI->title).d.d = (Data *)&(in_RDI->title).d.d[-4].super_QArrayData.alloc;
      (in_RDI->title).d.ptr = (char16_t *)((long)(in_RDI->title).d.ptr + 1);
      goto LAB_006e48a8;
    }
  }
  memset(local_40,0xaa,0x38);
  QTextBrowserPrivate::HistoryEntry::HistoryEntry
            (in_RDI,(HistoryEntry *)CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
  bVar4 = (in_RDI->title).d.ptr != (char16_t *)0x0;
  uVar5 = bVar4 && in_RSI == (char16_t *)0x0;
  uVar2 = (uint)(bVar4 && in_RSI == (char16_t *)0x0);
  bVar6 = uVar5;
  QArrayDataPointer<QTextBrowserPrivate::HistoryEntry>::detachAndGrow
            ((QArrayDataPointer<QTextBrowserPrivate::HistoryEntry> *)this_00,
             (GrowthPosition)((ulong)in_RSI >> 0x20),(qsizetype)in_RDX,
             (HistoryEntry **)
             CONCAT17(uVar1,CONCAT16(uVar5,CONCAT24(in_stack_ffffffffffffff7c,uVar2))),
             (QArrayDataPointer<QTextBrowserPrivate::HistoryEntry> *)in_RDI);
  if ((bVar6 & 1) == 0) {
    Inserter::Inserter(in_RDX,(QArrayDataPointer<QTextBrowserPrivate::HistoryEntry> *)
                              CONCAT17(uVar1,CONCAT16(bVar6,CONCAT24(in_stack_ffffffffffffff7c,uVar2
                                                                    ))),(qsizetype)in_RDI,
                       CONCAT17(uVar5,in_stack_ffffffffffffff68));
    Inserter::insertOne((Inserter *)in_RDI,(HistoryEntry *)CONCAT17(uVar5,in_stack_ffffffffffffff68)
                       );
    Inserter::~Inserter(&local_68);
  }
  else {
    QArrayDataPointer<QTextBrowserPrivate::HistoryEntry>::begin
              ((QArrayDataPointer<QTextBrowserPrivate::HistoryEntry> *)0x6e483c);
    QTextBrowserPrivate::HistoryEntry::HistoryEntry
              (in_RDI,(HistoryEntry *)CONCAT17(uVar5,in_stack_ffffffffffffff68));
    (in_RDI->title).d.d = (Data *)&(in_RDI->title).d.d[-4].super_QArrayData.alloc;
    (in_RDI->title).d.ptr = (char16_t *)((long)(in_RDI->title).d.ptr + 1);
  }
  QTextBrowserPrivate::HistoryEntry::~HistoryEntry(in_RDI);
LAB_006e48a8:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }